

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

void gost_crypt_mesh(void *ctx,uchar *iv,uchar *buf)

{
  byte *in_RDX;
  gost_ctx *in_RSI;
  byte *in_RDI;
  ossl_gost_cipher_ctx *c;
  
  if ((*(int *)(in_RDI + 8) != 0) && (*(int *)(in_RDI + 4) == 0x400)) {
    cryptopro_key_meshing((gost_ctx *)buf,(uchar *)c);
  }
  gostcrypt(in_RSI,in_RDX,in_RDI);
  *(uint *)(in_RDI + 4) = (*(uint *)(in_RDI + 4) & 0x3ff) + 8;
  return;
}

Assistant:

static void gost_crypt_mesh(void *ctx, unsigned char *iv, unsigned char *buf)
{
    struct ossl_gost_cipher_ctx *c = ctx;
    assert(c->count % 8 == 0 && c->count <= 1024);
    if (c->key_meshing && c->count == 1024) {
        cryptopro_key_meshing(&(c->cctx), iv);
    }
    gostcrypt(&(c->cctx), iv, buf);
    c->count = c->count % 1024 + 8;
}